

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

QDebug operator<<(QDebug d,QMetaType m)

{
  QTextStream *pQVar1;
  _func_int **pp_Var2;
  DataPointer *pDVar3;
  QString *pQVar4;
  storage_type *in_RCX;
  long in_RDX;
  long lVar5;
  QString *this;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)m.d_ptr);
  pQVar1 = *(QTextStream **)m.d_ptr;
  *(undefined1 *)&pQVar1[3]._vptr_QTextStream = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QMetaType(";
  QString::fromUtf8(&local_40,(QString *)0xa,ba);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&(*(QTextStream **)m.d_ptr)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)m.d_ptr,' ');
  }
  if (in_RDX == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = *(long *)(in_RDX + 0x18);
  }
  if (lVar5 == 0) {
    this = (QString *)0x0;
  }
  else {
    pQVar4 = (QString *)0xffffffffffffffff;
    do {
      this = (QString *)((long)&(pQVar4->d).d + 1);
      pDVar3 = &pQVar4->d;
      pQVar4 = this;
    } while (*(char *)((long)&pDVar3->d + lVar5 + 1) != '\0');
  }
  pQVar1 = *(QTextStream **)m.d_ptr;
  ba_00.m_data = in_RCX;
  ba_00.m_size = lVar5;
  QString::fromUtf8(&local_40,this,ba_00);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&(*(QTextStream **)m.d_ptr)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)m.d_ptr,' ');
  }
  pQVar1 = *(QTextStream **)m.d_ptr;
  ba_01.m_data = in_RCX;
  ba_01.m_size = (qsizetype)")";
  QString::fromUtf8(&local_40,(QString *)0x1,ba_01);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&(*(QTextStream **)m.d_ptr)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)m.d_ptr,' ');
  }
  pp_Var2 = *(_func_int ***)m.d_ptr;
  ((d.stream)->ts)._vptr_QTextStream = pp_Var2;
  pp_Var2 = pp_Var2 + 5;
  *(int *)pp_Var2 = *(int *)pp_Var2 + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QDebug)d.stream;
}

Assistant:

QDebug operator<<(QDebug d, QMetaType m)
{
    const QDebugStateSaver saver(d);
    return d.nospace() << "QMetaType(" << m.name() << ")";
}